

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectBuilder.cpp
# Opt level: O0

ObjectBuilder * __thiscall
ObjectBuilder::putAttribute
          (ObjectBuilder *this,Identifier *ident,bool constant,ptr<Value> *value,Scope scope)

{
  shared_ptr<Value> local_40;
  Scope local_2c;
  ptr<Value> *ppStack_28;
  Scope scope_local;
  ptr<Value> *value_local;
  Identifier *pIStack_18;
  bool constant_local;
  Identifier *ident_local;
  ObjectBuilder *this_local;
  
  local_2c = scope;
  ppStack_28 = value;
  value_local._7_1_ = constant;
  pIStack_18 = ident;
  ident_local = (Identifier *)this;
  std::shared_ptr<Value>::shared_ptr(&local_40,value);
  Environment::putValue(&this->members,ident,scope,&local_40,(bool)(value_local._7_1_ & 1));
  std::shared_ptr<Value>::~shared_ptr(&local_40);
  return this;
}

Assistant:

ObjectBuilder &ObjectBuilder::putAttribute(const Identifier &ident, bool constant, ptr<Value> value, Scope scope) {
    members.putValue(ident, scope, std::move(value), constant);
    return *this;
}